

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O1

int gz_look(gz_statep state)

{
  z_stream *strm;
  uint uVar1;
  Bytef *__src;
  int iVar2;
  undefined8 uVar3;
  uchar *puVar4;
  uchar *__ptr;
  ulong __n;
  
  strm = &state->strm;
  if (state->size == 0) {
    uVar1 = state->want;
    puVar4 = (uchar *)malloc((ulong)uVar1);
    state->in = puVar4;
    __ptr = (uchar *)malloc((ulong)(uVar1 * 2));
    state->out = __ptr;
    if (puVar4 == (uchar *)0x0 || __ptr == (uchar *)0x0) {
      free(__ptr);
      free(puVar4);
    }
    else {
      state->size = uVar1;
      (state->strm).avail_in = 0;
      (state->strm).next_in = (Bytef *)0x0;
      (state->strm).zalloc = (alloc_func)0x0;
      (state->strm).zfree = (free_func)0x0;
      (state->strm).opaque = (voidpf)0x0;
      iVar2 = inflateInit2_(strm,0x1f,"1.3.0.1-motley",0x70);
      if (iVar2 == 0) goto LAB_00107ec3;
      free(state->out);
      free(state->in);
      state->size = 0;
    }
    gz_error(state,-4,"out of memory");
LAB_00108011:
    iVar2 = -1;
  }
  else {
LAB_00107ec3:
    if ((state->strm).avail_in < 2) {
      iVar2 = gz_avail(state);
      if (iVar2 == -1) goto LAB_00108011;
      if ((state->strm).avail_in != 0) goto LAB_00107ee6;
    }
    else {
LAB_00107ee6:
      __n = (ulong)(state->strm).avail_in;
      if (((__n < 2) || (*strm->next_in != '\x1f')) || (strm->next_in[1] != 0x8b)) {
        if (state->direct == 0) {
          (state->strm).avail_in = 0;
          state->eof = 1;
          (state->x).have = 0;
          return 0;
        }
        puVar4 = state->out;
        __src = (state->strm).next_in;
        (state->x).next = puVar4;
        memcpy(puVar4,__src,__n);
        (state->x).have = (state->strm).avail_in;
        (state->strm).avail_in = 0;
        uVar3 = 0x100000001;
      }
      else {
        inflateReset(strm);
        uVar3 = 0x200000000;
      }
      state->direct = (int)uVar3;
      state->how = (int)((ulong)uVar3 >> 0x20);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

local int gz_look(gz_statep state) {
    z_streamp strm = &(state->strm);

    /* allocate read buffers and inflate memory */
    if (state->size == 0) {
        /* allocate buffers */
        state->in = (unsigned char *)malloc(state->want);
        state->out = (unsigned char *)malloc(state->want << 1);
        if (state->in == NULL || state->out == NULL) {
            free(state->out);
            free(state->in);
            gz_error(state, Z_MEM_ERROR, "out of memory");
            return -1;
        }
        state->size = state->want;

        /* allocate inflate memory */
        state->strm.zalloc = Z_NULL;
        state->strm.zfree = Z_NULL;
        state->strm.opaque = Z_NULL;
        state->strm.avail_in = 0;
        state->strm.next_in = Z_NULL;
        if (inflateInit2(&(state->strm), 15 + 16) != Z_OK) {    /* gunzip */
            free(state->out);
            free(state->in);
            state->size = 0;
            gz_error(state, Z_MEM_ERROR, "out of memory");
            return -1;
        }
    }

    /* get at least the magic bytes in the input buffer */
    if (strm->avail_in < 2) {
        if (gz_avail(state) == -1)
            return -1;
        if (strm->avail_in == 0)
            return 0;
    }

    /* look for gzip magic bytes -- if there, do gzip decoding (note: there is
       a logical dilemma here when considering the case of a partially written
       gzip file, to wit, if a single 31 byte is written, then we cannot tell
       whether this is a single-byte file, or just a partially written gzip
       file -- for here we assume that if a gzip file is being written, then
       the header will be written in a single operation, so that reading a
       single byte is sufficient indication that it is not a gzip file) */
    if (strm->avail_in > 1 &&
            strm->next_in[0] == 31 && strm->next_in[1] == 139) {
        inflateReset(strm);
        state->how = GZIP;
        state->direct = 0;
        return 0;
    }

    /* no gzip header -- if we were decoding gzip before, then this is trailing
       garbage.  Ignore the trailing garbage and finish. */
    if (state->direct == 0) {
        strm->avail_in = 0;
        state->eof = 1;
        state->x.have = 0;
        return 0;
    }

    /* doing raw i/o, copy any leftover input to output -- this assumes that
       the output buffer is larger than the input buffer, which also assures
       space for gzungetc() */
    state->x.next = state->out;
    memcpy(state->x.next, strm->next_in, strm->avail_in);
    state->x.have = strm->avail_in;
    strm->avail_in = 0;
    state->how = COPY;
    state->direct = 1;
    return 0;
}